

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int mem_write(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  jas_stream_memobj_t *local_60;
  long local_58;
  uint ret;
  size_t newpos;
  size_t newbufsize;
  jas_stream_memobj_t *m;
  size_t n;
  char *pcStack_20;
  uint cnt_local;
  char *buf_local;
  jas_stream_obj_t *obj_local;
  
  newbufsize = (size_t)obj;
  n._4_4_ = cnt;
  pcStack_20 = buf;
  buf_local = (char *)obj;
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x4c1,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
  }
  iVar2 = jas_getdbglevel();
  if (99 < iVar2) {
    jas_eprintf("mem_write(%p, %p, %u)\n",buf_local,pcStack_20,(ulong)n._4_4_);
  }
  uVar4 = *(long *)(newbufsize + 0x18) + (ulong)n._4_4_;
  if ((*(ulong *)(newbufsize + 8) < uVar4) && (*(int *)(newbufsize + 0x20) != 0)) {
    newpos = *(size_t *)(newbufsize + 8);
    do {
      if (uVar4 <= newpos) {
        iVar2 = jas_getdbglevel();
        if (99 < iVar2) {
          jas_eprintf("mem_write resizing from %d to %zu\n",*(undefined8 *)(newbufsize + 8),newpos);
        }
        if (newpos == 0) {
          __assert_fail("newbufsize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                        ,0x4d0,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
        }
        iVar2 = mem_resize((jas_stream_memobj_t *)newbufsize,newpos);
        if (iVar2 != 0) {
          return -1;
        }
        goto LAB_0011c0f2;
      }
      _Var1 = jas_safe_size_mul(newpos,2,&newpos);
    } while (_Var1);
    iVar2 = jas_getdbglevel();
    if (99 < iVar2) {
      jas_eprintf("new buffer size would cause overflow\n");
    }
    obj_local._4_4_ = 0xffffffff;
  }
  else {
LAB_0011c0f2:
    if (*(ulong *)(newbufsize + 0x10) < *(ulong *)(newbufsize + 0x18)) {
      if (*(ulong *)(newbufsize + 0x18) < *(ulong *)(newbufsize + 8)) {
        local_58 = *(long *)(newbufsize + 0x18);
      }
      else {
        local_58 = *(long *)(newbufsize + 8);
      }
      m = (jas_stream_memobj_t *)(local_58 - *(long *)(newbufsize + 0x10));
      if (m != (jas_stream_memobj_t *)0x0) {
        memset((void *)(*(long *)newbufsize + *(long *)(newbufsize + 0x10)),0,(size_t)m);
        *(long *)(newbufsize + 0x10) = (long)&m->buf_ + *(long *)(newbufsize + 0x10);
      }
      if (*(long *)(newbufsize + 0x18) != *(long *)(newbufsize + 0x10)) {
        return 0;
      }
    }
    m = (jas_stream_memobj_t *)(*(long *)(newbufsize + 8) - *(long *)(newbufsize + 0x18));
    local_60 = m;
    if ((jas_stream_memobj_t *)(ulong)n._4_4_ <= m) {
      local_60 = (jas_stream_memobj_t *)(ulong)n._4_4_;
    }
    uVar3 = (uint)local_60;
    if (uVar3 != 0) {
      memcpy((void *)(*(long *)newbufsize + *(long *)(newbufsize + 0x18)),pcStack_20,
             (ulong)local_60 & 0xffffffff);
      *(ulong *)(newbufsize + 0x18) = ((ulong)local_60 & 0xffffffff) + *(long *)(newbufsize + 0x18);
    }
    if (*(ulong *)(newbufsize + 0x10) < *(ulong *)(newbufsize + 0x18)) {
      *(undefined8 *)(newbufsize + 0x10) = *(undefined8 *)(newbufsize + 0x18);
    }
    obj_local._4_4_ = uVar3;
    if (uVar3 != n._4_4_) {
      __assert_fail("ret == cnt",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                    ,0x4eb,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int mem_write(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	size_t n;
	jas_stream_memobj_t *m = (jas_stream_memobj_t *)obj;
	size_t newbufsize;
	size_t newpos;

	assert(buf);

	JAS_DBGLOG(100, ("mem_write(%p, %p, %u)\n", obj, buf, cnt));
	newpos = m->pos_ + cnt;
	if (newpos > m->bufsize_ && m->growable_) {
		newbufsize = m->bufsize_;
		while (newbufsize < newpos) {
			//newbufsize <<= 1;
			if (!jas_safe_size_mul(newbufsize, 2, &newbufsize)) {
				JAS_DBGLOG(100, ("new buffer size would cause overflow\n"));
				return -1;
			}
		}
		JAS_DBGLOG(100, ("mem_write resizing from %d to %zu\n", m->bufsize_,
		  newbufsize));
		assert(newbufsize > 0);
		if (mem_resize(m, newbufsize)) {
			return -1;
		}
	}
	if (m->pos_ > m->len_) {
		/* The current position is beyond the end of the file, so
		  pad the file to the current position with zeros. */
		n = JAS_MIN(m->pos_, m->bufsize_) - m->len_;
		if (n > 0) {
			memset(&m->buf_[m->len_], 0, n);
			m->len_ += n;
		}
		if (m->pos_ != m->len_) {
			/* The buffer is not big enough. */
			return 0;
		}
	}
	n = m->bufsize_ - m->pos_;
	unsigned ret = JAS_MIN(n, cnt);
	if (ret > 0) {
		memcpy(&m->buf_[m->pos_], buf, ret);
		m->pos_ += ret;
	}
	if (m->pos_ > m->len_) {
		m->len_ = m->pos_;
	}
	assert(ret == cnt);
	return ret;
}